

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

qsizetype indexOf<QLatin1StringView>
                    (QExplicitlySharedDataPointer<QCborContainerPrivate> *o,QLatin1StringView key,
                    bool *keyExists)

{
  ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator> b;
  QLatin1StringView s;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  QCborContainerPrivate *this;
  qsizetype qVar4;
  undefined8 in_RCX;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator> it;
  ConstKeyIterator end;
  ConstKeyIterator begin;
  const_iterator in_stack_ffffffffffffff48;
  Element *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool bVar5;
  const_iterator in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  reference local_58;
  undefined8 local_50;
  const_iterator local_48;
  undefined8 local_40;
  Element *local_38;
  const_iterator local_30;
  undefined8 local_28;
  const_iterator local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.i = (Element *)0xaaaaaaaaaaaaaaaa;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x136c4b);
  cVar2 = QList<QtCbor::Element>::constBegin(in_stack_ffffffffffffff50);
  QJsonPrivate::ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator>::
  ObjectIterator((ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator> *)
                 0x136c6e,in_stack_ffffffffffffff48);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x136c87);
  cVar3 = QList<QtCbor::Element>::constEnd(in_stack_ffffffffffffff50);
  QJsonPrivate::ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator>::
  ObjectIterator((ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator> *)
                 0x136caa,in_stack_ffffffffffffff48);
  local_30.i = (Element *)0xaaaaaaaaaaaaaaaa;
  local_38 = local_20.i;
  local_40 = local_28;
  local_48.i = (Element *)
               std::
               lower_bound<QJsonPrivate::ObjectIterator<QtCbor::Element_const,QList<QtCbor::Element>::const_iterator>,QLatin1StringView,indexOf<QLatin1StringView>(QExplicitlySharedDataPointer<QCborContainerPrivate>const&,QLatin1StringView,bool*)::_lambda(QJsonPrivate::ObjectIterator<QtCbor::Element_const,QList<QtCbor::Element>::const_iterator>::value_type_const&,QLatin1StringView_const&)_1_>
                         (in_stack_ffffffffffffff98.i,in_stack_ffffffffffffff90.i,
                          (QLatin1StringView *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_RDI.i);
  local_50 = local_28;
  b.it.i._7_1_ = in_stack_ffffffffffffff67;
  b.it.i._0_7_ = in_stack_ffffffffffffff60;
  local_30.i = local_48.i;
  bVar1 = QJsonPrivate::operator!=
                    ((ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator>)
                     in_RDI.i,b);
  bVar5 = false;
  if (bVar1) {
    this = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x136d49);
    local_58 = QJsonPrivate::
               ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator>::
               operator*(in_stack_ffffffffffffff50);
    QJsonPrivate::ObjectIterator<const_QtCbor::Element,_QList<QtCbor::Element>::const_iterator>::
    reference::key(&local_58);
    s.m_size = (qsizetype)cVar2.i;
    s.m_data = (char *)cVar3.i;
    bVar5 = QCborContainerPrivate::stringEqualsElement<QLatin1StringView>
                      (this,in_stack_ffffffffffffff50,s);
  }
  *(bool *)in_RCX = bVar5;
  qVar4 = QList<QtCbor::Element>::const_iterator::operator-(&local_30,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return qVar4;
}

Assistant:

static qsizetype indexOf(const QExplicitlySharedDataPointer<QCborContainerPrivate> &o,
                         String key, bool *keyExists)
{
    const auto begin = QJsonPrivate::ConstKeyIterator(o->elements.constBegin());
    const auto end = QJsonPrivate::ConstKeyIterator(o->elements.constEnd());

    const auto it = std::lower_bound(
                begin, end, key,
                [&](const QJsonPrivate::ConstKeyIterator::value_type &e, const String &key) {
        return o->stringCompareElement(e.key(), key, QtCbor::Comparison::ForOrdering) < 0;
    });

    *keyExists = (it != end) && o->stringEqualsElement((*it).key(), key);
    return it.it - begin.it;
}